

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::BuildsystemFileScope::BuildsystemFileScope(BuildsystemFileScope *this,cmMakefile *mf)

{
  string *str;
  cmState *this_00;
  cmGlobalGenerator *pcVar1;
  cmMakefile *pcVar2;
  cmake *pcVar3;
  cmFileLockPool *this_01;
  cmStateSnapshot local_100;
  cmStateSnapshot local_e8;
  cmAlphaNum local_c0;
  cmStateDirectory local_90;
  cmAlphaNum local_68;
  undefined1 local_38 [8];
  string currentStart;
  cmMakefile *mf_local;
  BuildsystemFileScope *this_local;
  
  this->Makefile = mf;
  currentStart.field_2._8_8_ = mf;
  cmStateSnapshot::cmStateSnapshot(&this->Snapshot,(cmState *)0x0);
  this->ReportError = true;
  cmStateSnapshot::GetDirectory(&local_90,&this->Makefile->StateSnapshot);
  str = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_90);
  cmAlphaNum::cmAlphaNum(&local_68,str);
  cmAlphaNum::cmAlphaNum(&local_c0,"/CMakeLists.txt");
  cmStrCat<>((string *)local_38,&local_68,&local_c0);
  cmStateSnapshot::SetListFile(&this->Makefile->StateSnapshot,(string *)local_38);
  this_00 = cmStateSnapshot::GetState(&this->Makefile->StateSnapshot);
  cmState::CreatePolicyScopeSnapshot(&local_e8,this_00,&this->Makefile->StateSnapshot);
  pcVar2 = this->Makefile;
  (pcVar2->StateSnapshot).Position.Position = local_e8.Position.Position;
  (pcVar2->StateSnapshot).State = local_e8.State;
  (pcVar2->StateSnapshot).Position.Tree = local_e8.Position.Tree;
  PushFunctionBlockerBarrier(this->Makefile);
  pcVar1 = GetGlobalGenerator((cmMakefile *)currentStart.field_2._8_8_);
  this->GG = pcVar1;
  pcVar2 = cmGlobalGenerator::GetCurrentMakefile(this->GG);
  this->CurrentMakefile = pcVar2;
  pcVar3 = cmGlobalGenerator::GetCMakeInstance(this->GG);
  cmake::GetCurrentSnapshot(&local_100,pcVar3);
  (this->Snapshot).Position.Position = local_100.Position.Position;
  (this->Snapshot).State = local_100.State;
  (this->Snapshot).Position.Tree = local_100.Position.Tree;
  pcVar3 = cmGlobalGenerator::GetCMakeInstance(this->GG);
  cmake::SetCurrentSnapshot(pcVar3,&this->Snapshot);
  cmGlobalGenerator::SetCurrentMakefile(this->GG,(cmMakefile *)currentStart.field_2._8_8_);
  this_01 = cmGlobalGenerator::GetFileLockPool(this->GG);
  cmFileLockPool::PushFileScope(this_01);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

BuildsystemFileScope(cmMakefile* mf)
    : Makefile(mf)
  {
    std::string currentStart =
      cmStrCat(this->Makefile->StateSnapshot.GetDirectory().GetCurrentSource(),
               "/CMakeLists.txt");
    this->Makefile->StateSnapshot.SetListFile(currentStart);
    this->Makefile->StateSnapshot =
      this->Makefile->StateSnapshot.GetState()->CreatePolicyScopeSnapshot(
        this->Makefile->StateSnapshot);
    this->Makefile->PushFunctionBlockerBarrier();

    this->GG = mf->GetGlobalGenerator();
    this->CurrentMakefile = this->GG->GetCurrentMakefile();
    this->Snapshot = this->GG->GetCMakeInstance()->GetCurrentSnapshot();
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
    this->GG->SetCurrentMakefile(mf);
#if !defined(CMAKE_BOOTSTRAP)
    this->GG->GetFileLockPool().PushFileScope();
#endif
  }